

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

int Aig_ManReduceLachesCount(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_28;
  int Diffs;
  int Counter;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_28 = 0;
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                  ,0x15f,"int Aig_ManReduceLachesCount(Aig_Man_t *)");
  }
  Diffs = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= Diffs) {
      iVar1 = Aig_ManCoNum(p);
      iVar2 = Aig_ManRegNum(p);
      for (Diffs = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCos), Diffs < iVar1; Diffs = Diffs + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Diffs);
        pAVar5 = Aig_ObjFanin0(pAVar4);
        iVar1 = Aig_ObjFaninC0(pAVar4);
        if (iVar1 == 0) {
          if ((*(ulong *)&pAVar5->field_0x18 >> 4 & 1) == 0) {
            *(ulong *)&pAVar5->field_0x18 =
                 *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef | 0x10;
          }
          else {
            local_28 = local_28 + 1;
          }
        }
        else if ((*(ulong *)&pAVar5->field_0x18 >> 5 & 1) == 0) {
          *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffdf | 0x20;
        }
        else {
          local_28 = local_28 + 1;
        }
      }
      iVar1 = Aig_ManCoNum(p);
      iVar2 = Aig_ManRegNum(p);
      for (Diffs = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCos), Diffs < iVar1; Diffs = Diffs + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Diffs);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffdf;
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef;
      }
      return local_28;
    }
    pvVar3 = Vec_PtrEntry(p->vObjs,Diffs);
    if ((pvVar3 != (void *)0x0) &&
       (((*(ulong *)((long)pvVar3 + 0x18) >> 4 & 1) != 0 ||
        ((*(ulong *)((long)pvVar3 + 0x18) >> 5 & 1) != 0)))) break;
    Diffs = Diffs + 1;
  }
  __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                ,0x161,"int Aig_ManReduceLachesCount(Aig_Man_t *)");
}

Assistant:

int Aig_ManReduceLachesCount( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin;
    int i, Counter = 0, Diffs = 0;
    assert( Aig_ManRegNum(p) > 0 );
    Aig_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjFaninC0(pObj) )
        {
            if ( pFanin->fMarkB )
                Counter++;
            else
                pFanin->fMarkB = 1;
        }
        else
        {
            if ( pFanin->fMarkA )
                Counter++;
            else
                pFanin->fMarkA = 1;
        }
    }
    // count fanins that have both attributes
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        Diffs += pFanin->fMarkA && pFanin->fMarkB;
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
//    printf( "Diffs = %d.\n", Diffs );
    return Counter;
}